

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastio.h
# Opt level: O0

void __thiscall OutputStream::writeSQFloat(OutputStream *this,SQFloat f)

{
  undefined4 in_XMM0_Da;
  int64_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  writeInt64((OutputStream *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void writeSQFloat(SQFloat f) {
#ifdef SQUSEDOUBLE
    writeInt32(*((int32_t*)&f));
#else
    writeInt64(*((int64_t*)&f));
#endif // SQUSEDOUBLE
  }